

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Aig_Obj_t *
createArenaViolation
          (Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pWindowBegins,Aig_Obj_t *pWithinWindow,
          Vec_Ptr_t *vMasterBarriers,Vec_Ptr_t *vBarrierLo,Vec_Ptr_t *vBarrierLiDriver,
          Vec_Ptr_t *vMonotoneDisjunctionNodes)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Aig_Obj_t *p1;
  Vec_Ptr_t *__ptr;
  void **ppvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  long lVar8;
  Aig_Obj_t *pAVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  if (vBarrierLiDriver == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierLiDriver != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb6,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (vMonotoneDisjunctionNodes == (Vec_Ptr_t *)0x0) {
    __assert_fail("vMonotoneDisjunctionNodes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb7,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  pAVar9 = pAigNew->pConst1;
  __ptr = collectBarrierDisjunctions(pAigOld,pAigNew,vMasterBarriers);
  if (__ptr == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierSignals != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xbc,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (vMonotoneDisjunctionNodes->nSize != 0) {
    __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xbe,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  pAVar9 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
  iVar1 = __ptr->nSize;
  lVar8 = (long)iVar1;
  if (lVar8 < 1) {
    if (vMasterBarriers->nSize != 0) goto LAB_00596c3b;
  }
  else {
    uVar11 = (ulong)(uint)vMonotoneDisjunctionNodes->nCap;
    iVar7 = 0;
    lVar12 = 0;
    do {
      pvVar3 = __ptr->pArray[lVar12];
      iVar10 = (int)uVar11;
      if (iVar7 == iVar10) {
        if (iVar10 < 0x10) {
          if (vMonotoneDisjunctionNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vMonotoneDisjunctionNodes->pArray,0x80);
          }
          vMonotoneDisjunctionNodes->pArray = ppvVar4;
          vMonotoneDisjunctionNodes->nCap = 0x10;
          uVar11 = 0x10;
        }
        else {
          uVar11 = (ulong)(uint)(iVar10 * 2);
          if (vMonotoneDisjunctionNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar11 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(vMonotoneDisjunctionNodes->pArray,uVar11 * 8);
          }
          vMonotoneDisjunctionNodes->pArray = ppvVar4;
          vMonotoneDisjunctionNodes->nCap = iVar10 * 2;
        }
      }
      else {
        ppvVar4 = vMonotoneDisjunctionNodes->pArray;
      }
      iVar10 = vMonotoneDisjunctionNodes->nSize;
      iVar7 = iVar10 + 1;
      vMonotoneDisjunctionNodes->nSize = iVar7;
      ppvVar4[iVar10] = pvVar3;
      lVar12 = lVar12 + 1;
    } while (lVar8 != lVar12);
    if (iVar7 != vMasterBarriers->nSize) {
LAB_00596c3b:
      __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                    ,0xc1,
                    "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (0 < iVar1) {
      lVar12 = 0;
      do {
        pAVar6 = (Aig_Obj_t *)__ptr->pArray[lVar12];
        pAVar5 = Aig_And(pAigNew,pAVar6,pWindowBegins);
        if (vBarrierLo->nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        p1 = (Aig_Obj_t *)vBarrierLo->pArray[lVar12];
        pAVar5 = Aig_Or(pAigNew,pAVar5,p1);
        uVar2 = vBarrierLiDriver->nSize;
        if (uVar2 == vBarrierLiDriver->nCap) {
          if ((int)uVar2 < 0x10) {
            if (vBarrierLiDriver->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vBarrierLiDriver->pArray,0x80);
            }
            vBarrierLiDriver->pArray = ppvVar4;
            vBarrierLiDriver->nCap = 0x10;
          }
          else {
            if (vBarrierLiDriver->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vBarrierLiDriver->pArray,(ulong)uVar2 << 4);
            }
            vBarrierLiDriver->pArray = ppvVar4;
            vBarrierLiDriver->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar4 = vBarrierLiDriver->pArray;
        }
        iVar1 = vBarrierLiDriver->nSize;
        vBarrierLiDriver->nSize = iVar1 + 1;
        ppvVar4[iVar1] = pAVar5;
        pAVar6 = Aig_Xor(pAigNew,pAVar6,p1);
        pAVar6 = Aig_And(pAigNew,pAVar6,pWithinWindow);
        pAVar9 = Aig_Or(pAigNew,pAVar6,pAVar9);
        lVar12 = lVar12 + 1;
      } while (lVar8 != lVar12);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pAVar9;
}

Assistant:

Aig_Obj_t *createArenaViolation(
		Aig_Man_t *pAigOld,
		Aig_Man_t *pAigNew, 
		Aig_Obj_t *pWindowBegins, 
		Aig_Obj_t *pWithinWindow, 
		Vec_Ptr_t *vMasterBarriers, 
		Vec_Ptr_t *vBarrierLo,
		Vec_Ptr_t *vBarrierLiDriver,
		Vec_Ptr_t *vMonotoneDisjunctionNodes
		)
{
	Aig_Obj_t *pWindowBeginsLocal = pWindowBegins;
	Aig_Obj_t *pWithinWindowLocal = pWithinWindow;
	int i;
	Aig_Obj_t *pObj, *pObjAnd1, *pObjOr1, *pObjAnd2, *pObjBarrierLo, *pObjBarrierSwitch, *pObjArenaViolation;
	Vec_Ptr_t *vBarrierSignals;

	assert( vBarrierLiDriver != NULL );
	assert( vMonotoneDisjunctionNodes != NULL );

	pObjArenaViolation = Aig_Not(Aig_ManConst1( pAigNew ));

	vBarrierSignals = collectBarrierDisjunctions(pAigOld, pAigNew, vMasterBarriers);
	assert( vBarrierSignals != NULL );

	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0 );
	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
		Vec_PtrPush( vMonotoneDisjunctionNodes, pObj );
	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers ) );

	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
	{
		//pObjNew = driverToPoNew( pAigOld, pObj );
		pObjAnd1 = Aig_And(pAigNew, pObj, pWindowBeginsLocal);
		pObjBarrierLo = (Aig_Obj_t *)Vec_PtrEntry( vBarrierLo, i );
		pObjOr1 = Aig_Or(pAigNew, pObjAnd1, pObjBarrierLo);
		Vec_PtrPush( vBarrierLiDriver, pObjOr1 );

		pObjBarrierSwitch = Aig_Xor( pAigNew, pObj, pObjBarrierLo );
		pObjAnd2 = Aig_And( pAigNew, pObjBarrierSwitch, pWithinWindowLocal );
		pObjArenaViolation = Aig_Or( pAigNew, pObjAnd2, pObjArenaViolation );
	}

	Vec_PtrFree(vBarrierSignals);
	return pObjArenaViolation;
}